

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

size_t determine_serialized_size_additional_trees(IsoForest *model,size_t old_ntrees)

{
  bool bVar1;
  vector<IsoTree,_std::allocator<IsoTree>_> *pvVar2;
  size_t sVar3;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_RDI;
  IsoTree *node;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  size_t ix;
  size_t n_bytes;
  vector<IsoTree,_std::allocator<IsoTree>_> *this;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_> local_30;
  const_reference local_28;
  vector<IsoTree,_std::allocator<IsoTree>_> *local_20;
  size_t local_18;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *local_8;
  
  local_18 = 0;
  local_20 = (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0;
  local_8 = in_RDI;
  while( true ) {
    this = local_20;
    pvVar2 = (vector<IsoTree,_std::allocator<IsoTree>_> *)
             std::
             vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ::size(local_8);
    if (pvVar2 <= this) break;
    local_18 = local_18 + 8;
    local_28 = std::
               vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ::operator[](local_8,(size_type)local_20);
    local_30._M_current = (IsoTree *)std::vector<IsoTree,_std::allocator<IsoTree>_>::begin(this);
    std::vector<IsoTree,_std::allocator<IsoTree>_>::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                          *)in_stack_ffffffffffffffc0,
                         (__normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
                          *)this);
      if (!bVar1) break;
      in_stack_ffffffffffffffc0 =
           __gnu_cxx::
           __normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>::
           operator*(&local_30);
      sVar3 = get_size_node(in_stack_ffffffffffffffc0);
      local_18 = sVar3 + local_18;
      __gnu_cxx::__normal_iterator<const_IsoTree_*,_std::vector<IsoTree,_std::allocator<IsoTree>_>_>
      ::operator++(&local_30);
    }
    local_20 = (vector<IsoTree,_std::allocator<IsoTree>_> *)
               ((long)&(local_20->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  return local_18;
}

Assistant:

size_t determine_serialized_size_additional_trees(const IsoForest &model, size_t old_ntrees) noexcept
{
    size_t n_bytes = 0;
    for (size_t ix = 0; ix < model.trees.size(); ix++) {
        n_bytes += sizeof(size_t);
        for (const auto &node : model.trees[ix])
            n_bytes += get_size_node(node);
    }
    return n_bytes;
}